

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opl.cpp
# Opt level: O1

void operator_output(op_type *op_pt,Bit32s modulator,Bit32s trem)

{
  if (op_pt->op_state != 5) {
    op_pt->lastcval = op_pt->cval;
    op_pt->cval = (int)((double)trem * 0.0625 * op_pt->step_amp * op_pt->vol *
                       (double)(int)op_pt->cur_wform
                                    [modulator + op_pt->wfpos >> 0x10 & op_pt->cur_wmask]);
  }
  return;
}

Assistant:

void operator_output(op_type* op_pt, Bit32s modulator, Bit32s trem) {
	if (op_pt->op_state != OF_TYPE_OFF) {
		op_pt->lastcval = op_pt->cval;
		Bit32u i = (Bit32u)((op_pt->wfpos+modulator)/FIXEDPT);

		// wform: -16384 to 16383 (0x4000)
		// trem :  32768 to 65535 (0x10000)
		// step_amp: 0.0 to 1.0
		// vol  : 1/2^14 to 1/2^29 (/0x4000; /1../0x8000)

		op_pt->cval = (Bit32s)(op_pt->step_amp*op_pt->vol*op_pt->cur_wform[i&op_pt->cur_wmask]*trem/16.0);
	}
}